

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void r4k_invalidate_tlb_mips(CPUMIPSState *env,int idx,int use_extra)

{
  uint32_t *puVar1;
  CPUState *cpu;
  uint *puVar2;
  undefined8 *puVar3;
  ushort uVar4;
  CPUMIPSTLBContext *pCVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  target_ulong_conflict addr;
  bool bVar13;
  
  cpu = (CPUState *)(env[-4].tcs[0xd].mmr + 5);
  uVar11 = (uint)(ushort)((ushort)env->CP0_EntryHi_ASID_mask & (ushort)env->CP0_EntryHi);
  pCVar5 = env->tlb;
  bVar13 = (env->CP0_Config5 & 0x20000) != 0;
  if (bVar13) {
    uVar11 = env->CP0_MemoryMapID;
  }
  puVar2 = (uint *)((long)&pCVar5->mmu + (long)idx * 0x28);
  if (bVar13) {
    uVar10 = puVar2[3];
  }
  else {
    uVar10 = (uint)(ushort)puVar2[2];
  }
  uVar4 = (ushort)puVar2[4];
  if (((uVar4 & 1) != 0) || (uVar10 == uVar11)) {
    if ((use_extra == 0) || (0x7f < (ulong)pCVar5->tlb_in_use)) {
      uVar11 = puVar2[1] | 0x1fff;
      if ((char)uVar4 < '\0') {
        uVar10 = *puVar2 & ~uVar11;
        uVar12 = uVar11 >> 1 | uVar10;
        for (; uVar10 < uVar12; uVar10 = uVar10 + 0x1000) {
          tlb_flush_page_mips(cpu,uVar10);
        }
        uVar4 = (ushort)puVar2[4];
      }
      if ((uVar4 >> 8 & 1) != 0) {
        addr = (uVar11 >> 1) + 1 | ~uVar11 & *puVar2;
        uVar11 = uVar11 | addr;
        for (; addr - 1 < uVar11; addr = addr + 0x1000) {
          tlb_flush_page_mips(cpu,addr);
        }
      }
    }
    else {
      lVar9 = (ulong)pCVar5->tlb_in_use * 0x28;
      *(undefined8 *)((long)&pCVar5->mmu + lVar9 + 0x20) = *(undefined8 *)(puVar2 + 8);
      uVar6 = *(undefined8 *)puVar2;
      uVar7 = *(undefined8 *)(puVar2 + 2);
      uVar8 = *(undefined8 *)(puVar2 + 6);
      puVar3 = (undefined8 *)((long)&pCVar5->mmu + lVar9 + 0x10);
      *puVar3 = *(undefined8 *)(puVar2 + 4);
      puVar3[1] = uVar8;
      puVar3 = (undefined8 *)((long)&pCVar5->mmu + lVar9);
      *puVar3 = uVar6;
      puVar3[1] = uVar7;
      puVar1 = &env->tlb->tlb_in_use;
      *puVar1 = *puVar1 + 1;
    }
  }
  return;
}

Assistant:

void cpu_mips_store_status(CPUMIPSState *env, target_ulong val)
{
    uint32_t mask = env->CP0_Status_rw_bitmask;
    target_ulong old = env->CP0_Status;

    if (env->insn_flags & ISA_MIPS32R6) {
        bool has_supervisor = extract32(mask, CP0St_KSU, 2) == 0x3;
#if defined(TARGET_MIPS64)
        uint32_t ksux = (1 << CP0St_KX) & val;
        ksux |= (ksux >> 1) & val; /* KX = 0 forces SX to be 0 */
        ksux |= (ksux >> 1) & val; /* SX = 0 forces UX to be 0 */
        val = (val & ~(7 << CP0St_UX)) | ksux;
#endif
        if (has_supervisor && extract32(val, CP0St_KSU, 2) == 0x3) {
            mask &= ~(3 << CP0St_KSU);
        }
        mask &= ~(((1 << CP0St_SR) | (1 << CP0St_NMI)) & val);
    }

    env->CP0_Status = (old & ~mask) | (val & mask);
#if defined(TARGET_MIPS64)
    if ((env->CP0_Status ^ old) & (old & (7 << CP0St_UX))) {
        /* Access to at least one of the 64-bit segments has been disabled */
        tlb_flush(env_cpu(env));
    }
#endif
    if (env->CP0_Config3 & (1 << CP0C3_MT)) {
        sync_c0_status(env, env, env->current_tc);
    } else {
        compute_hflags(env);
    }
}